

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_message(connectdata *conn,uchar cmd,void *msg,size_t msg_len)

{
  char *pcVar1;
  void *pvVar2;
  CURLcode CVar3;
  __pid_t _Var4;
  ushort uVar5;
  
  CVar3 = Curl_get_upload_buffer(conn->data);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  pcVar1 = (conn->data->state).ulbuf;
  pvVar2 = (conn->data->req).protop;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  uVar5 = (short)msg_len + 0x20;
  *(ushort *)(pcVar1 + 2) = uVar5 * 0x100 | uVar5 >> 8;
  pcVar1[4] = -1;
  pcVar1[5] = 'S';
  pcVar1[6] = 'M';
  pcVar1[7] = 'B';
  pcVar1[8] = cmd;
  pcVar1[0xd] = '\x18';
  pcVar1[0xe] = 'A';
  pcVar1[0xf] = '\0';
  *(unsigned_short *)(pcVar1 + 0x20) = (conn->proto).smbc.uid;
  *(undefined2 *)(pcVar1 + 0x1c) = *(undefined2 *)((long)pvVar2 + 0x10);
  _Var4 = getpid();
  *(short *)(pcVar1 + 0x10) = (short)((uint)_Var4 >> 0x10);
  *(short *)(pcVar1 + 0x1e) = (short)_Var4;
  memcpy((conn->data->state).ulbuf + 0x24,msg,msg_len);
  CVar3 = smb_send(conn,msg_len + 0x24,0);
  return CVar3;
}

Assistant:

static CURLcode smb_send_message(struct connectdata *conn, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  CURLcode result = Curl_get_upload_buffer(conn->data);
  if(result)
    return result;
  smb_format_message(conn, (struct smb_header *)conn->data->state.ulbuf,
                     cmd, msg_len);
  memcpy(conn->data->state.ulbuf + sizeof(struct smb_header),
         msg, msg_len);

  return smb_send(conn, sizeof(struct smb_header) + msg_len, 0);
}